

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifgfu(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  objnum oVar2;
  runcxdef *ctx_00;
  runsdef *prVar3;
  voccxdef *pvVar4;
  uint uVar5;
  int iVar6;
  vocddef *pvVar7;
  uint uVar8;
  runsdef val;
  runsdef local_48;
  
  ctx_00 = ctx->bifcxrun;
  prVar3 = ctx_00->runcxsp;
  pvVar4 = ctx_00->runcxvoc;
  uVar1 = prVar3[-1].runstyp;
  ctx_00->runcxsp = prVar3 + -1;
  if (uVar1 == '\n') {
    if (prVar3[-1].runstyp != '\n') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3f3);
    }
    oVar2 = prVar3[-1].runsv.runsvobj;
    ctx_00->runcxsp = prVar3 + -2;
    local_48.runstyp = prVar3[-2].runstyp;
    local_48._1_7_ = *(undefined7 *)&prVar3[-2].field_0x1;
    local_48.runsv = prVar3[-2].runsv;
    uVar8 = pvVar4->voccxfuc;
    if (uVar8 != 0) {
      pvVar7 = pvVar4->voccxfus;
      do {
        if ((pvVar7->vocdfn == oVar2) && ((pvVar7->vocdarg).runstyp == local_48.runstyp)) {
          uVar5 = datsiz((uint)local_48.runstyp,&local_48.runsv);
          iVar6 = bcmp(&local_48.runsv,&(pvVar7->vocdarg).runsv,(ulong)uVar5);
          if (iVar6 == 0) {
LAB_00212746:
            runpnum(ctx_00,(ulong)pvVar7->vocdtim);
            return;
          }
        }
        pvVar7 = pvVar7 + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  else {
    if (prVar3[-1].runstyp != '\x02') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3f2);
    }
    oVar2 = prVar3[-1].runsv.runsvobj;
    ctx_00->runcxsp = prVar3 + -2;
    if (prVar3[-2].runstyp != '\r') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3f4);
    }
    uVar8 = pvVar4->voccxalc;
    if (uVar8 != 0) {
      pvVar7 = pvVar4->voccxalm;
      do {
        if ((pvVar7->vocdfn == oVar2) && (pvVar7->vocdprp == prVar3[-2].runsv.runsvobj))
        goto LAB_00212746;
        pvVar7 = pvVar7 + 1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
  }
  runpush(ctx_00,5,&local_48);
  return;
}

Assistant:

void bifgfu(bifcxdef *ctx, int argc)
{
    vocddef  *daem;
    objnum    func;
    runsdef   val;
    runcxdef *rcx = ctx->bifcxrun;
    int       slots;
    prpnum    prop;
    voccxdef *vcx = ctx->bifcxrun->runcxvoc;

    bifcntargs(ctx, 2, argc);
 
    if (runtostyp(rcx) == DAT_FNADDR)
    {
        /* check on a setfuse()-style fuse: get fnaddr, parm */
        func = runpopfn(rcx);
        runpop(rcx, &val);

        for (slots = vcx->voccxfuc, daem = vcx->voccxfus ;
             slots ; ++daem, --slots)
        {
            if (daem->vocdfn == func
                && daem->vocdarg.runstyp == val.runstyp
                && !memcmp(&val.runsv, &daem->vocdarg.runsv,
                           (size_t)datsiz(val.runstyp, &val.runsv)))
                goto ret_num;
        }
    }
    else
    {
        /* check on a notify()-style fuse: get object, &message */
        func = runpopobj(rcx);
        prop = runpopprp(rcx);

        for (slots = vcx->voccxalc, daem = vcx->voccxalm ;
             slots ; ++daem, --slots)
        {
            if (daem->vocdfn == func && daem->vocdprp == prop)
                goto ret_num;
        }
    }
    
    /* didn't find anything - return nil */
    runpush(rcx, DAT_NIL, &val);
    return;
    
ret_num:
    /* return current daem->vocdtim */
    runpnum(rcx, (long)daem->vocdtim);
    return;
}